

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnitTest.cpp
# Opt level: O2

void __thiscall
RoomAndComfortableBed2_Test8_Test::RoomAndComfortableBed2_Test8_Test
          (RoomAndComfortableBed2_Test8_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_00189d20;
  return;
}

Assistant:

TEST(RoomAndComfortableBed2, Test8){
    Infector::Container ioc;

    ioc.bindSingleAs<ComfortableBedVS,  IBedVS>();
    ioc.bindSingleAs<BedRoomVS,         IRoomVS>();

    ioc.wire<ComfortableBedVS>();
    ioc.wire<BedRoomVS,           IBedVS>();

    auto room = ioc.buildSingle<IRoomVS>();
    room->interact();

    EXPECT_EQ(1, CCallBedVS);
    EXPECT_EQ(1, CCallRoomVS);
}